

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

void acmod_activate_hmm(acmod_t *acmod,hmm_t *hmm)

{
  byte bVar1;
  ushort uVar2;
  bitvec_t *pbVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  
  if (acmod->compallsen == '\0') {
    bVar1 = hmm->n_emit_state;
    uVar4 = (ulong)bVar1;
    if (hmm->mpx == '\0') {
      if (uVar4 != 0) {
        if (bVar1 != 3) {
          if (bVar1 != 5) {
            pbVar3 = acmod->senone_active_vec;
            uVar6 = 0;
            do {
              pbVar3[hmm->senid[uVar6] >> 5] =
                   pbVar3[hmm->senid[uVar6] >> 5] | 1 << ((byte)hmm->senid[uVar6] & 0x1f);
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
            return;
          }
          pbVar3 = acmod->senone_active_vec;
          puVar5 = pbVar3 + (hmm->senid[4] >> 5);
          *puVar5 = *puVar5 | 1 << ((byte)hmm->senid[4] & 0x1f);
          puVar5 = pbVar3 + (hmm->senid[3] >> 5);
          *puVar5 = *puVar5 | 1 << ((byte)hmm->senid[3] & 0x1f);
        }
        pbVar3 = acmod->senone_active_vec;
        pbVar3[hmm->senid[2] >> 5] = pbVar3[hmm->senid[2] >> 5] | 1 << ((byte)hmm->senid[2] & 0x1f);
        pbVar3[hmm->senid[1] >> 5] = pbVar3[hmm->senid[1] >> 5] | 1 << ((byte)hmm->senid[1] & 0x1f);
        bVar1 = (byte)hmm->senid[0];
        puVar5 = pbVar3 + (hmm->senid[0] >> 5);
LAB_0011e7f3:
        *puVar5 = *puVar5 | 1 << (bVar1 & 0x1f);
        return;
      }
    }
    else if (uVar4 != 0) {
      if (bVar1 != 3) {
        if (bVar1 != 5) {
          uVar6 = 0;
          do {
            if ((ulong)hmm->senid[uVar6] != 0xffff) {
              uVar2 = hmm->ctx->sseq[hmm->senid[uVar6]][uVar6];
              acmod->senone_active_vec[uVar2 >> 5] =
                   acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
            }
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          return;
        }
        if ((ulong)hmm->senid[4] != 0xffff) {
          uVar2 = hmm->ctx->sseq[hmm->senid[4]][4];
          acmod->senone_active_vec[uVar2 >> 5] =
               acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
        }
        if ((ulong)hmm->senid[3] != 0xffff) {
          uVar2 = hmm->ctx->sseq[hmm->senid[3]][3];
          acmod->senone_active_vec[uVar2 >> 5] =
               acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
        }
      }
      if ((ulong)hmm->senid[2] != 0xffff) {
        uVar2 = hmm->ctx->sseq[hmm->senid[2]][2];
        acmod->senone_active_vec[uVar2 >> 5] =
             acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      }
      if ((ulong)hmm->senid[1] != 0xffff) {
        uVar2 = hmm->ctx->sseq[hmm->senid[1]][1];
        acmod->senone_active_vec[uVar2 >> 5] =
             acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      }
      if ((ulong)hmm->senid[0] != 0xffff) {
        uVar2 = *hmm->ctx->sseq[hmm->senid[0]];
        bVar1 = (byte)uVar2;
        puVar5 = (uint *)((ulong)(uVar2 >> 3 & 0xfffffffc) + (long)acmod->senone_active_vec);
        goto LAB_0011e7f3;
      }
    }
  }
  return;
}

Assistant:

void
acmod_activate_hmm(acmod_t *acmod, hmm_t *hmm)
{
    int i;

    if (acmod->compallsen)
        return;
    if (hmm_is_mpx(hmm)) {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            MPX_BITVEC_SET(acmod, hmm, 4);
            MPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            MPX_BITVEC_SET(acmod, hmm, 2);
            MPX_BITVEC_SET(acmod, hmm, 1);
            MPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                MPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
    else {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            NONMPX_BITVEC_SET(acmod, hmm, 4);
            NONMPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            NONMPX_BITVEC_SET(acmod, hmm, 2);
            NONMPX_BITVEC_SET(acmod, hmm, 1);
            NONMPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                NONMPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
}